

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecker.c
# Opt level: O0

void typecheck_var_assignment
               (CompilerState *compiler_state,VariableType *var_type,AstNode *expr,
               StringObject *var_name)

{
  _Bool _Var1;
  int iVar2;
  anon_union_72_25_595a31af_for_AstNode_2 *b;
  char *local_340;
  char local_338 [8];
  char tempbuf_2 [256];
  char tempbuf_1 [256];
  char tempbuf [256];
  VariableType *expr_type;
  char *variable_name;
  StringObject *var_name_local;
  AstNode *expr_local;
  VariableType *var_type_local;
  CompilerState *compiler_state_local;
  
  if (var_type->type_code != RAVI_TANY) {
    if (var_name == (StringObject *)0x0) {
      local_340 = "unknown-TODO";
    }
    else {
      local_340 = var_name->str;
    }
    b = &expr->field_2;
    if ((b->common_expr).type.type_code != RAVI_TANY) {
      if (var_type->type_code == RAVI_TNUMINT) {
        if (((b->common_expr).type.type_code != RAVI_TNUMFLT) &&
           (((expr->type != EXPR_UNARY || ((expr->field_2).unary_expr.unary_op != UNOPR_LEN)) &&
            ((b->common_expr).type.type_code != RAVI_TNUMINT)))) {
          snprintf(tempbuf_1 + 0xf8,0x100,
                   "%d: Assignment to local symbol %s is not type compatible\n",
                   (ulong)expr->line_number,local_340);
          handle_error(compiler_state,tempbuf_1 + 0xf8);
        }
      }
      else if (var_type->type_code == RAVI_TNUMFLT) {
        if (((b->common_expr).type.type_code != RAVI_TNUMINT) &&
           ((b->common_expr).type.type_code != RAVI_TNUMFLT)) {
          snprintf(tempbuf_2 + 0xf8,0x100,
                   "%d: Assignment to local symbol %s is not type compatible\n",
                   (ulong)expr->line_number,local_340);
          handle_error(compiler_state,tempbuf_2 + 0xf8);
        }
      }
      else {
        if (var_type->type_code == RAVI_TARRAYFLT) {
          if (((expr->type == EXPR_TABLE_LITERAL) &&
              ((b->common_expr).type.type_code == RAVI_TTABLE)) &&
             (((expr->field_2).table_expr.inferred_type_code == RAVI_TARRAYFLT ||
              (iVar2 = raviX_ptrlist_size((PtrList *)(expr->field_2).function_stmt.function_expr),
              iVar2 == 0)))) {
            (b->common_expr).type.type_code = RAVI_TARRAYFLT;
          }
        }
        else if (((var_type->type_code == RAVI_TARRAYINT) && (expr->type == EXPR_TABLE_LITERAL)) &&
                (((b->common_expr).type.type_code == RAVI_TTABLE &&
                 (((expr->field_2).table_expr.inferred_type_code == RAVI_TARRAYINT ||
                  (iVar2 = raviX_ptrlist_size((PtrList *)(expr->field_2).function_stmt.function_expr
                                             ), iVar2 == 0)))))) {
          (b->common_expr).type.type_code = RAVI_TARRAYINT;
        }
        if ((((b->common_expr).type.type_code != RAVI_TNIL) ||
            ((var_type->type_code & RAVI_TNIL) == ~RAVI_TANY)) &&
           (_Var1 = is_type_same(var_type,(VariableType *)&b->return_stmt), !_Var1)) {
          snprintf(local_338,0x100,"%d: Assignment to local symbol %s is not type compatible\n",
                   (ulong)expr->line_number,local_340);
          handle_error(compiler_state,local_338);
        }
      }
    }
  }
  return;
}

Assistant:

static void typecheck_var_assignment(CompilerState *compiler_state, VariableType *var_type, AstNode *expr,
				     const StringObject *var_name)
{
	if (var_type->type_code == RAVI_TANY)
		// Any value can be assigned to type ANY
		return;
	const char *variable_name = var_name ? var_name->str : "unknown-TODO";
	VariableType *expr_type = &expr->common_expr.type;

	// If expr is ANY type then allow it as a runtime check will be
	// done
	if (expr_type->type_code == RAVI_TANY) {
		return;
	}

	if (var_type->type_code == RAVI_TNUMINT) {
		/* if the expr is of type number or # operator then insert @integer operator */
		if (expr_type->type_code == RAVI_TNUMFLT ||
		    (expr->type == EXPR_UNARY && expr->unary_expr.unary_op == UNOPR_LEN)) {
			/* Okay, but backend must do appropriate conversion */
			;
		} else if (expr_type->type_code != RAVI_TNUMINT) {
			char tempbuf[256];
			snprintf(tempbuf, sizeof tempbuf, "%d: Assignment to local symbol %s is not type compatible\n",
				 expr->line_number, variable_name);
			handle_error(compiler_state, tempbuf);
		}
		return;
	}
	if (var_type->type_code == RAVI_TNUMFLT) {
		if (expr_type->type_code == RAVI_TNUMINT) {
			/* Okay, but backend must do appropriate conversion */
			;
		} else if (expr_type->type_code != RAVI_TNUMFLT) {
			char tempbuf[256];
			snprintf(tempbuf, sizeof tempbuf, "%d: Assignment to local symbol %s is not type compatible\n",
				 expr->line_number, variable_name);
			handle_error(compiler_state, tempbuf);
		}
		return;
	}
	if (var_type->type_code == RAVI_TARRAYFLT) {
		if (expr->type == EXPR_TABLE_LITERAL && expr_type->type_code == RAVI_TTABLE &&
		    (expr->table_expr.inferred_type_code == RAVI_TARRAYFLT ||
		     raviX_ptrlist_size((PtrList *)expr->table_expr.expr_list) == 0)) {
			// Note following updates the AST node too
			expr_type->type_code = RAVI_TARRAYFLT;
		}
	} else if (var_type->type_code == RAVI_TARRAYINT) {
		if (expr->type == EXPR_TABLE_LITERAL && expr_type->type_code == RAVI_TTABLE &&
		    (expr->table_expr.inferred_type_code == RAVI_TARRAYINT ||
		     raviX_ptrlist_size((PtrList *)expr->table_expr.expr_list) == 0)) {
			// Note following updates the AST node too
			expr_type->type_code = RAVI_TARRAYINT;
		}
	}
	if (expr_type->type_code == RAVI_TNIL && (var_type->type_code & RAVI_TM_NIL) != 0) {
		// NILable type so allow nil
		return;
	}
	// all other types must strictly match
	if (!is_type_same(var_type, expr_type)) { // We should probably check type convert-ability here
		char tempbuf[256];
		snprintf(tempbuf, sizeof tempbuf, "%d: Assignment to local symbol %s is not type compatible\n",
			 expr->line_number, variable_name);
		handle_error(compiler_state, tempbuf);
	}
}